

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdns.h
# Opt level: O3

bool mdns::query(int fd,sockaddr_in *address)

{
  int iVar1;
  uint uVar2;
  time_t tVar3;
  int *piVar4;
  ssize_t sVar5;
  ostream *poVar6;
  char *__s;
  size_t sVar7;
  bool bVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  socklen_t addressSize;
  string packet;
  string name;
  fd_set fds;
  sockaddr_storage addressStorage;
  socklen_t local_1a0;
  int local_19c;
  string local_198;
  sockaddr_in *local_178;
  long local_170;
  string local_168;
  timeval local_148;
  fd_set local_138;
  sockaddr local_b0 [8];
  
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  local_178 = address;
  std::__cxx11::string::_M_construct((ulong)&local_198,'\0');
  local_1a0 = 0x80;
  tVar3 = time((time_t *)0x0);
  lVar11 = tVar3 + 10;
  iVar10 = fd + 0x3f;
  if (-1 < fd) {
    iVar10 = fd;
  }
  uVar9 = 1L << ((byte)(fd % 0x40) & 0x3f);
  local_170 = (long)(iVar10 >> 6);
  local_19c = fd + 1;
  iVar10 = 0;
  do {
    tVar3 = time((time_t *)0x0);
    if (lVar11 < tVar3) {
      if (s_verbose == true) {
        puts("\x1b[2K\r - Timeout waiting for mdns response, sending a new");
      }
      sendRequest(fd);
      tVar3 = time((time_t *)0x0);
      lVar11 = tVar3 + 10;
      iVar10 = iVar10 + 1;
    }
    else {
      local_138.fds_bits[0xe] = 0;
      local_138.fds_bits[0xf] = 0;
      local_138.fds_bits[0xc] = 0;
      local_138.fds_bits[0xd] = 0;
      local_138.fds_bits[10] = 0;
      local_138.fds_bits[0xb] = 0;
      local_138.fds_bits[8] = 0;
      local_138.fds_bits[9] = 0;
      local_138.fds_bits[6] = 0;
      local_138.fds_bits[7] = 0;
      local_138.fds_bits[4] = 0;
      local_138.fds_bits[5] = 0;
      local_138.fds_bits[2] = 0;
      local_138.fds_bits[3] = 0;
      local_138.fds_bits[0] = 0;
      local_138.fds_bits[1] = 0;
      local_138.fds_bits[local_170] = local_138.fds_bits[local_170] | uVar9;
      local_138.fds_bits[0] = local_138.fds_bits[0] | 1;
      local_148.tv_usec = 0;
      local_148.tv_sec = 1;
      iVar1 = select(local_19c,&local_138,(fd_set *)0x0,(fd_set *)0x0,&local_148);
      piVar4 = __errno_location();
      if (*piVar4 != 4) {
        if (iVar1 == 0) {
          uVar2 = (byte)(query::spinnerPos + 1) & 7;
          query::spinnerPos = (uint8_t)uVar2;
          printf("%c Waiting for response",(ulong)(uint)(int)"-\\|/-\\|/"[uVar2]);
          iVar1 = iVar10 % 10;
          if (0 < iVar1) {
            do {
              putchar(0x2e);
              iVar1 = iVar1 + -1;
            } while (iVar1 != 0);
          }
          fflush(_stdout);
          printf("\x1b[2K\r");
        }
        else if (iVar1 < 0) {
          perror(" ! Error while waiting to read");
        }
        else {
          if ((local_138.fds_bits[0] & 1U) != 0) {
            uVar2 = getchar();
            if ((uVar2 == 0x1b) || (uVar2 == 0x71)) {
              puts("Aborted");
              goto LAB_00107991;
            }
            if (s_verbose == true) {
              printf("Unhandled key 0x%x\n",(ulong)uVar2);
            }
          }
          if ((local_138.fds_bits[local_170] & uVar9) != 0) {
            sVar5 = recvfrom(fd,local_198._M_dataplus._M_p,local_198._M_string_length,0,local_b0,
                             &local_1a0);
            if (sVar5 < 0) {
              perror(" ! Failed to read packet");
              goto LAB_00107991;
            }
            if (local_b0[0].sa_family == 2) {
              memcpy(local_178,local_b0,(ulong)local_1a0);
              if (s_verbose == true) {
                puts(" < Got response");
              }
              std::__cxx11::string::resize((ulong)&local_198,(char)sVar5);
              parsePacket(&local_168,&local_198);
              bVar8 = true;
              if (local_168._M_string_length != 0) {
                if (local_168._M_string_length == DAT_0012a8c0) {
                  iVar1 = bcmp(local_168._M_dataplus._M_p,queryName_abi_cxx11_,
                               local_168._M_string_length);
                  if (iVar1 == 0) {
                    bVar8 = false;
                    goto LAB_00107963;
                  }
                }
                if (s_verbose == true) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr," - Got wrong name \'",0x13);
                  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)&std::cerr,local_168._M_dataplus._M_p,
                                      local_168._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\' from ",7);
                  __s = inet_ntoa((in_addr)(local_178->sin_addr).s_addr);
                  if (__s == (char *)0x0) {
                    std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
                  }
                  else {
                    sVar7 = strlen(__s);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar6,__s,sVar7);
                  }
                  bVar8 = true;
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
                  std::ostream::put((char)poVar6);
                  std::ostream::flush();
                }
              }
LAB_00107963:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_168._M_dataplus._M_p != &local_168.field_2) {
                operator_delete(local_168._M_dataplus._M_p,
                                local_168.field_2._M_allocated_capacity + 1);
              }
              if (!bVar8) {
                bVar8 = true;
                goto LAB_00107993;
              }
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr," ! Got wrong family, not IPv4 ",0x1e);
              poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
              std::ostream::put((char)poVar6);
              std::ostream::flush();
            }
          }
        }
      }
    }
    if (s_running == '\x01') {
LAB_00107991:
      bVar8 = false;
LAB_00107993:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2) {
        operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
      }
      return bVar8;
    }
  } while( true );
}

Assistant:

bool query(const int fd, sockaddr_in *address)
{
    // TODO: continously loop and update when new devices appear

    std::string packet(512, '\0');

    sockaddr_storage addressStorage;
    socklen_t addressSize = sizeof(addressStorage);

    time_t endTime = time(nullptr) + 10;
    int pingTries = 0;

    do {
        if (time(nullptr) > endTime) {
            if (s_verbose) printf("\033[2K\r - Timeout waiting for mdns response, sending a new\n");
            sendRequest(fd);
            endTime = time(nullptr) + 10;
            pingTries++;
            continue;
        }

        fd_set fds;
        FD_ZERO(&fds);
        FD_SET(fd, &fds);
        FD_SET(STDIN_FILENO, &fds);

        timeval tv = {0, 0};
        //tv.tv_usec = 100000; // 100ms, need dat nice spinner
        tv.tv_sec = 1;

        int st = select(fd+1, &fds, nullptr, nullptr, &tv);
        if (errno == EINTR) {
            continue;
        }
        if (st == 0) {
            static const char spinner[] = { '-', '\\', '|', '/', '-', '\\', '|', '/', };
            static uint8_t spinnerPos = 0;
            spinnerPos = (spinnerPos + 1) % sizeof(spinner);
            printf("%c Waiting for response", spinner[spinnerPos]);
            for (int i=0; i<pingTries % 10; i++) printf(".");
            fflush(stdout);
            printf("\033[2K\r"); // Erase the line, which won't be visible until the next flush
            continue;
        }
        if (st < 0) {
            if (errno != EINTR) {
                perror(" ! Error while waiting to read");
            }
            continue;
        }

        if (FD_ISSET(STDIN_FILENO, &fds)) {
            const int key = getchar();
            switch(key) {
            case 'q':
            case '\x1b':
                puts("Aborted");
                return false;
            default:
                if (s_verbose) printf("Unhandled key 0x%x\n", key);
                break;
            }
        }
        if (!FD_ISSET(fd, &fds)) {
            continue;
        }

        long size = recvfrom(
                fd,
                packet.data(),
                packet.size(),
                0,
                reinterpret_cast<sockaddr*>(&addressStorage),
                &addressSize
            );

        if (size < 0) {
            perror(" ! Failed to read packet");
            return false;
        }

        if (addressStorage.ss_family != AF_INET) {
            std::cerr << " ! Got wrong family, not IPv4 " << addressStorage.ss_family << std::endl;
            continue;
        }

        memcpy(address, &addressStorage, addressSize);
        if (s_verbose) {
            puts(" < Got response");
        }

        packet.resize(size);

        std::string name = parsePacket(packet);
        if (name.empty()) {
            continue;
        }
        if (name != queryName) {
            if (s_verbose) {
                std::cerr << " - Got wrong name '" << name << "' from " << inet_ntoa(address->sin_addr) << std::endl;
            }
            continue;
        }

        return true;
    } while (s_running);

    return false;
}